

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_paeth_predictor_32x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  int iVar21;
  uint8_t *puVar22;
  bool bVar23;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined1 auVar24 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  __m128i l16;
  __m128i bl;
  __m128i ah;
  __m128i al;
  __m128i tl16;
  __m128i bh;
  
  auVar24 = *(undefined1 (*) [16])above;
  auVar25 = *(undefined1 (*) [16])(above + 0x10);
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar24._0_13_;
  auVar1[0xe] = auVar24[7];
  auVar3[0xc] = auVar24[6];
  auVar3._0_12_ = auVar24._0_12_;
  auVar3._13_2_ = auVar1._13_2_;
  auVar5[0xb] = 0;
  auVar5._0_11_ = auVar24._0_11_;
  auVar5._12_3_ = auVar3._12_3_;
  auVar7[10] = auVar24[5];
  auVar7._0_10_ = auVar24._0_10_;
  auVar7._11_4_ = auVar5._11_4_;
  auVar9[9] = 0;
  auVar9._0_9_ = auVar24._0_9_;
  auVar9._10_5_ = auVar7._10_5_;
  auVar11[8] = auVar24[4];
  auVar11._0_8_ = auVar24._0_8_;
  auVar11._9_6_ = auVar9._9_6_;
  auVar15._7_8_ = 0;
  auVar15._0_7_ = auVar11._8_7_;
  auVar17._1_8_ = SUB158(auVar15 << 0x40,7);
  auVar17[0] = auVar24[3];
  auVar17._9_6_ = 0;
  auVar18._1_10_ = SUB1510(auVar17 << 0x30,5);
  auVar18[0] = auVar24[2];
  auVar18._11_4_ = 0;
  auVar13[2] = auVar24[1];
  auVar13._0_2_ = auVar24._0_2_;
  auVar13._3_12_ = SUB1512(auVar18 << 0x20,3);
  al[0]._0_2_ = auVar24._0_2_ & 0xff;
  al._2_13_ = auVar13._2_13_;
  al[1]._7_1_ = 0;
  ah[0] = (ulong)CONCAT16(auVar24[0xb],
                          (uint6)CONCAT14(auVar24[10],(uint)CONCAT12(auVar24[9],(ushort)auVar24[8]))
                         );
  ah[1]._0_1_ = auVar24[0xc];
  ah[1]._1_1_ = 0;
  ah[1]._2_1_ = auVar24[0xd];
  ah[1]._3_1_ = 0;
  ah[1]._4_1_ = auVar24[0xe];
  ah[1]._5_1_ = 0;
  ah[1]._6_1_ = auVar24[0xf];
  ah[1]._7_1_ = 0;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar25._0_13_;
  auVar2[0xe] = auVar25[7];
  auVar4[0xc] = auVar25[6];
  auVar4._0_12_ = auVar25._0_12_;
  auVar4._13_2_ = auVar2._13_2_;
  auVar6[0xb] = 0;
  auVar6._0_11_ = auVar25._0_11_;
  auVar6._12_3_ = auVar4._12_3_;
  auVar8[10] = auVar25[5];
  auVar8._0_10_ = auVar25._0_10_;
  auVar8._11_4_ = auVar6._11_4_;
  auVar10[9] = 0;
  auVar10._0_9_ = auVar25._0_9_;
  auVar10._10_5_ = auVar8._10_5_;
  auVar12[8] = auVar25[4];
  auVar12._0_8_ = auVar25._0_8_;
  auVar12._9_6_ = auVar10._9_6_;
  auVar16._7_8_ = 0;
  auVar16._0_7_ = auVar12._8_7_;
  auVar19._1_8_ = SUB158(auVar16 << 0x40,7);
  auVar19[0] = auVar25[3];
  auVar19._9_6_ = 0;
  auVar20._1_10_ = SUB1510(auVar19 << 0x30,5);
  auVar20[0] = auVar25[2];
  auVar20._11_4_ = 0;
  auVar14[2] = auVar25[1];
  auVar14._0_2_ = auVar25._0_2_;
  auVar14._3_12_ = SUB1512(auVar20 << 0x20,3);
  bl[0]._0_2_ = auVar25._0_2_ & 0xff;
  bl._2_13_ = auVar14._2_13_;
  bl[1]._7_1_ = 0;
  bh[0] = (ulong)CONCAT16(auVar25[0xb],
                          (uint6)CONCAT14(auVar25[10],(uint)CONCAT12(auVar25[9],(ushort)auVar25[8]))
                         );
  bh[1]._0_1_ = auVar25[0xc];
  bh[1]._1_1_ = 0;
  bh[1]._2_1_ = auVar25[0xd];
  bh[1]._3_1_ = 0;
  bh[1]._4_1_ = auVar25[0xe];
  bh[1]._5_1_ = 0;
  bh[1]._6_1_ = auVar25[0xf];
  bh[1]._7_1_ = 0;
  auVar24 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  tl16[0]._0_4_ = auVar24._0_4_;
  auVar24 = *(undefined1 (*) [16])left;
  puVar22 = dst + 0x10;
  iVar21 = 0x10;
  auVar25 = _DAT_00434a80;
  tl16[0]._4_4_ = (undefined4)tl16[0];
  tl16[1]._0_4_ = (undefined4)tl16[0];
  tl16[1]._4_4_ = (undefined4)tl16[0];
  while (bVar23 = iVar21 != 0, iVar21 = iVar21 + -1, bVar23) {
    l16 = (__m128i)pshufb(auVar24,auVar25);
    paeth_16x1_pred(&l16,&al,&ah,&tl16);
    paeth_16x1_pred(&l16,&bl,&bh,&tl16);
    local_b8 = auVar25._0_2_;
    sStack_b6 = auVar25._2_2_;
    sStack_b4 = auVar25._4_2_;
    sStack_b2 = auVar25._6_2_;
    sStack_b0 = auVar25._8_2_;
    sStack_ae = auVar25._10_2_;
    sStack_ac = auVar25._12_2_;
    sStack_aa = auVar25._14_2_;
    *(undefined8 *)(puVar22 + -0x10) = extraout_XMM0_Qa;
    *(undefined8 *)(puVar22 + -8) = extraout_XMM0_Qb;
    *(undefined8 *)puVar22 = extraout_XMM0_Qa_00;
    *(undefined8 *)(puVar22 + 8) = extraout_XMM0_Qb_00;
    auVar25._0_2_ = local_b8 + 1;
    auVar25._2_2_ = sStack_b6 + 1;
    auVar25._4_2_ = sStack_b4 + 1;
    auVar25._6_2_ = sStack_b2 + 1;
    auVar25._8_2_ = sStack_b0 + 1;
    auVar25._10_2_ = sStack_ae + 1;
    auVar25._12_2_ = sStack_ac + 1;
    auVar25._14_2_ = sStack_aa + 1;
    puVar22 = puVar22 + stride;
  }
  auVar24 = *(undefined1 (*) [16])(left + 0x10);
  iVar21 = 0x10;
  auVar26 = _DAT_00434a80;
  while (bVar23 = iVar21 != 0, iVar21 = iVar21 + -1, bVar23) {
    l16 = (__m128i)pshufb(auVar24,auVar26);
    paeth_16x1_pred(&l16,&al,&ah,&tl16);
    paeth_16x1_pred(&l16,&bl,&bh,&tl16);
    local_b8 = auVar26._0_2_;
    sStack_b6 = auVar26._2_2_;
    sStack_b4 = auVar26._4_2_;
    sStack_b2 = auVar26._6_2_;
    sStack_b0 = auVar26._8_2_;
    sStack_ae = auVar26._10_2_;
    sStack_ac = auVar26._12_2_;
    sStack_aa = auVar26._14_2_;
    *(undefined8 *)(puVar22 + -0x10) = extraout_XMM0_Qa_01;
    *(undefined8 *)(puVar22 + -8) = extraout_XMM0_Qb_01;
    *(undefined8 *)puVar22 = extraout_XMM0_Qa_02;
    *(undefined8 *)(puVar22 + 8) = extraout_XMM0_Qb_02;
    auVar26._0_2_ = local_b8 + 1;
    auVar26._2_2_ = sStack_b6 + 1;
    auVar26._4_2_ = sStack_b4 + 1;
    auVar26._6_2_ = sStack_b2 + 1;
    auVar26._8_2_ = sStack_b0 + 1;
    auVar26._10_2_ = sStack_ae + 1;
    auVar26._12_2_ = sStack_ac + 1;
    auVar26._14_2_ = sStack_aa + 1;
    puVar22 = puVar22 + stride;
  }
  return;
}

Assistant:

void aom_paeth_predictor_32x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l = _mm_load_si128((const __m128i *)left);
  __m128i l16;

  int i;
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

    _mm_store_si128((__m128i *)dst, r32l);
    _mm_store_si128((__m128i *)(dst + 16), r32h);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }

  rep = _mm_set1_epi16((short)0x8000);
  l = _mm_load_si128((const __m128i *)(left + 16));
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

    _mm_store_si128((__m128i *)dst, r32l);
    _mm_store_si128((__m128i *)(dst + 16), r32h);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}